

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

ExceptionOr<kj::Promise<NoCopy>_> * __thiscall
kj::_::ExceptionOr<kj::Promise<NoCopy>_>::operator=
          (ExceptionOr<kj::Promise<NoCopy>_> *this,ExceptionOr<kj::Promise<NoCopy>_> *param_1)

{
  Maybe<kj::Exception>::operator=((Maybe<kj::Exception> *)this,(Maybe<kj::Exception> *)param_1);
  if (param_1 != this) {
    if ((this->value).ptr.isSet == true) {
      (this->value).ptr.isSet = false;
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&(this->value).ptr.field_1.value
                );
    }
    if ((param_1->value).ptr.isSet == true) {
      (this->value).ptr.field_1 = (param_1->value).ptr.field_1;
      (param_1->value).ptr.field_1 =
           (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<NoCopy>_>_2)0x0;
      (this->value).ptr.isSet = true;
    }
  }
  if ((param_1->value).ptr.isSet == true) {
    (param_1->value).ptr.isSet = false;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)
               &(param_1->value).ptr.field_1.value);
  }
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;